

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var Js::JavascriptProxy::GetName(ScriptContext *requestContext,PropertyId propertyId)

{
  bool bVar1;
  ThreadContext *this;
  PropertyRecord *this_00;
  undefined8 local_28;
  Var name;
  PropertyRecord *propertyRecord;
  PropertyId propertyId_local;
  ScriptContext *requestContext_local;
  
  this = ScriptContext::GetThreadContext(requestContext);
  this_00 = ThreadContext::GetPropertyName(this,propertyId);
  bVar1 = PropertyRecord::IsSymbol(this_00);
  if (bVar1) {
    local_28 = (PropertyString *)ScriptContext::GetSymbol(requestContext,this_00);
  }
  else {
    local_28 = ScriptContext::GetPropertyString(requestContext,this_00);
  }
  return local_28;
}

Assistant:

Var JavascriptProxy::GetName(ScriptContext* requestContext, PropertyId propertyId)
    {
        const PropertyRecord* propertyRecord = requestContext->GetThreadContext()->GetPropertyName(propertyId);
        Var name;
        if (propertyRecord->IsSymbol())
        {
            name = requestContext->GetSymbol(propertyRecord);
        }
        else
        {
            name = requestContext->GetPropertyString(propertyRecord);
        }
        return name;
    }